

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O3

try_get_result_type * __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::try_get
          (try_get_result_type *__return_storage_ptr__,
          olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this,
          art_key_type k)

{
  atomic<long> *paVar1;
  void *pvVar2;
  byte bVar3;
  uint uVar4;
  optimistic_lock *poVar5;
  undefined1 this_00 [8];
  version_type vVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 shifted_key_u64;
  ulong uVar11;
  ulong uVar12;
  basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *this_01;
  find_result fVar13;
  undefined1 local_58 [8];
  read_critical_section parent_critical_section;
  undefined1 local_40 [8];
  read_critical_section node_critical_section;
  
  optimistic_lock::try_read_lock((optimistic_lock *)local_58);
  if (local_58 != (undefined1  [8])0x0) {
    uVar12 = (this->root).value._M_i.tagged_ptr;
    if (uVar12 == 0) {
      olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::try_get();
      goto LAB_0013dbbb;
    }
    bVar7 = optimistic_lock::check
                      ((optimistic_lock *)local_58,(version_type)parent_critical_section.lock);
    if (bVar7) {
      optimistic_lock::try_read_lock((optimistic_lock *)local_40);
      shifted_key_u64 = k.field_0;
      vVar6.version = (version_tag_type)__return_storage_ptr__;
      if (local_40 == (undefined1  [8])0x0) {
LAB_0013dc25:
        bVar7 = false;
      }
      else {
        do {
          parent_critical_section.version.version = vVar6.version;
          this_01 = (basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *)
                    (uVar12 & 0xfffffffffffffff8);
          if ((((atomic<long> *)((long)local_58 + 8))->super___atomic_base<long>)._M_i < 1)
          goto LAB_0013dd22;
          poVar5 = *(optimistic_lock **)local_58;
          LOCK();
          paVar1 = (atomic<long> *)((long)local_58 + 8);
          pvVar2 = (void *)(paVar1->super___atomic_base<long>)._M_i;
          (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
          UNLOCK();
          if (parent_critical_section.lock != poVar5) {
            if ((long)pvVar2 < 1) goto LAB_0013dd03;
            local_58 = (undefined1  [8])0x0;
            break;
          }
          if ((long)pvVar2 < 1) goto LAB_0013dd03;
          local_58 = (undefined1  [8])0x0;
          if ((uVar12 & 7) == 0) {
            iVar9 = detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>::cmp
                              (this_01,(void *)k.field_0,pvVar2);
            __return_storage_ptr__ = (try_get_result_type *)parent_critical_section.version;
            if (iVar9 != 0) {
              if ((((atomic<long> *)((long)local_40 + 8))->super___atomic_base<long>)._M_i < 1)
              goto LAB_0013dd22;
              poVar5 = *(optimistic_lock **)local_40;
              LOCK();
              paVar1 = (atomic<long> *)((long)local_40 + 8);
              lVar10 = (paVar1->super___atomic_base<long>)._M_i;
              (paVar1->super___atomic_base<long>)._M_i =
                   (paVar1->super___atomic_base<long>)._M_i + -1;
              UNLOCK();
              if (node_critical_section.lock != poVar5) goto joined_r0x0013dcfd;
LAB_0013db94:
              if (lVar10 < 1) {
LAB_0013dd03:
                __assert_fail("old_value > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                              ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
              }
              local_40 = (undefined1  [8])0x0;
              *(undefined1 *)(parent_critical_section.version.version + 0x10) = 0;
              bVar7 = true;
              __return_storage_ptr__ =
                   (try_get_result_type *)parent_critical_section.version.version;
              goto LAB_0013dbad;
            }
            uVar8 = this_01->key_size;
            uVar4 = this_01->value_size;
            if ((((atomic<long> *)((long)local_40 + 8))->super___atomic_base<long>)._M_i < 1)
            goto LAB_0013dd22;
            poVar5 = *(optimistic_lock **)local_40;
            LOCK();
            paVar1 = (atomic<long> *)((long)local_40 + 8);
            lVar10 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (node_critical_section.lock == poVar5) {
              if (lVar10 < 1) goto LAB_0013dd03;
              local_40 = (undefined1  [8])0x0;
              detail::qsbr_ptr_base::register_active_ptr(this_01->data + uVar8);
              *(byte **)__return_storage_ptr__ = this_01->data + uVar8;
              *(ulong *)((long)__return_storage_ptr__ + 8) = (ulong)uVar4;
              *(undefined1 *)((long)__return_storage_ptr__ + 0x10) = 1;
              *(undefined1 *)((long)__return_storage_ptr__ + 0x18) = 1;
              detail::qsbr_ptr_base::unregister_active_ptr((void *)0x0);
              goto LAB_0013dbb2;
            }
joined_r0x0013dcfd:
            parent_critical_section.version.version = (version_tag_type)__return_storage_ptr__;
            if (lVar10 < 1) goto LAB_0013dd03;
            local_40 = (undefined1  [8])0x0;
            goto LAB_0013dc25;
          }
          bVar3 = *(byte *)((long)&this_01->value_size + 3);
          if (7 < bVar3) {
            __assert_fail("result <= key_prefix_capacity",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                          ,0x298,
                          "key_prefix_size unodb::detail::key_prefix<unodb::detail::basic_art_key<unsigned long>, unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::critical_section_policy>::length() const [ArtKey = unodb::detail::basic_art_key<unsigned long>, CriticalSectionPolicy = unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::critical_section_policy]"
                         );
          }
          uVar8 = detail::
                  key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                  ::get_shared_length((key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                                       *)&this_01->key_size,shifted_key_u64.key);
          if (uVar8 < bVar3) {
LAB_0013db62:
            if ((((atomic<long> *)((long)local_40 + 8))->super___atomic_base<long>)._M_i < 1) {
LAB_0013dd22:
              __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                            ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
            }
            poVar5 = *(optimistic_lock **)local_40;
            LOCK();
            paVar1 = (atomic<long> *)((long)local_40 + 8);
            lVar10 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            __return_storage_ptr__ = (try_get_result_type *)parent_critical_section.version.version;
            if (node_critical_section.lock != poVar5) goto joined_r0x0013dcfd;
            goto LAB_0013db94;
          }
          if (uVar8 != bVar3) {
            __assert_fail("shared_key_prefix_length == key_prefix_length",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                          ,0x6d4,
                          "typename olc_db<Key, Value>::try_get_result_type unodb::olc_db<unsigned long, std::span<const std::byte>>::try_get(art_key_type) const [Key = unsigned long, Value = std::span<const std::byte>]"
                         );
          }
          uVar11 = shifted_key_u64.key >> ((bVar3 & 7) << 3);
          fVar13 = detail::
                   basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                   ::find_child((basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                 *)this_01,(node_type)uVar12 & (I256|I48),(byte)uVar11);
          this_00 = local_40;
          if (fVar13.second ==
              (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *
              )0x0) goto LAB_0013db62;
          uVar12 = ((fVar13.second)->value)._M_i.tagged_ptr;
          local_58 = local_40;
          local_40 = (undefined1  [8])0x0;
          parent_critical_section.lock = node_critical_section.lock;
          bVar7 = optimistic_lock::check
                            ((optimistic_lock *)this_00,(version_type)node_critical_section.lock);
          if (!bVar7) {
            local_58 = (undefined1  [8])0x0;
            *(undefined1 *)(parent_critical_section.version.version + 0x18) = 0;
            __return_storage_ptr__ = (try_get_result_type *)parent_critical_section.version;
            goto LAB_0013dbb2;
          }
          optimistic_lock::read_critical_section::~read_critical_section
                    ((read_critical_section *)local_40);
          optimistic_lock::try_read_lock((optimistic_lock *)local_40);
          shifted_key_u64.key = uVar11 >> 8;
          vVar6 = parent_critical_section.version;
        } while ((__atomic_base<unsigned_long>)local_40 != (__atomic_base<unsigned_long>)0x0);
        bVar7 = false;
        __return_storage_ptr__ = (try_get_result_type *)parent_critical_section.version.version;
      }
LAB_0013dbad:
      (__return_storage_ptr__->
      super__Optional_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_false,_false>).
      _M_payload.
      super__Optional_payload<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_true,_false,_false>
      .super__Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>.
      _M_engaged = bVar7;
LAB_0013dbb2:
      optimistic_lock::read_critical_section::~read_critical_section
                ((read_critical_section *)local_40);
      goto LAB_0013dbbb;
    }
    local_58 = (undefined1  [8])0x0;
  }
  (__return_storage_ptr__->
  super__Optional_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_false,_false>).
  _M_payload.
  super__Optional_payload<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_true,_false,_false>
  .super__Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>._M_engaged =
       false;
LAB_0013dbbb:
  optimistic_lock::read_critical_section::~read_critical_section((read_critical_section *)local_58);
  return __return_storage_ptr__;
}

Assistant:

typename olc_db<Key, Value>::try_get_result_type olc_db<Key, Value>::try_get(
    art_key_type k) const noexcept {
  auto parent_critical_section = root_pointer_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(parent_critical_section.must_restart())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return {};
    // LCOV_EXCL_STOP
  }

  detail::olc_node_ptr node{root.load()};  // load root into [node].

  if (UNODB_DETAIL_UNLIKELY(node == nullptr)) {  // special path if empty tree.
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock())) {
      // LCOV_EXCL_START
      spin_wait_loop_body();
      return {};
      // LCOV_EXCL_STOP
    }
    // return an empty result (breaks out of caller's while(true) loop)
    return std::make_optional<get_result>(std::nullopt);
  }

  // A check() is required before acting on [node] by taking the lock.
  if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return {};
    // LCOV_EXCL_STOP
  }

  auto remaining_key{k};

  while (true) {
    // Lock version chaining (node and parent)
    auto node_critical_section = node_ptr_lock(node).try_read_lock();
    if (UNODB_DETAIL_UNLIKELY(node_critical_section.must_restart())) return {};
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    const auto node_type = node.type();

    if (node_type == node_type::LEAF) {
      const auto* const leaf{node.ptr<leaf_type*>()};
      if (leaf->matches(k)) {
        const auto val_view{leaf->get_value_view()};
        if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
          return {};  // LCOV_EXCL_LINE
        return qsbr_ptr_span<const std::byte>{val_view};
      }
      if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
        return {};  // LCOV_EXCL_LINE
      return std::make_optional<get_result>(std::nullopt);
    }

    auto* const inode{node.ptr<inode_type*>()};
    const auto& key_prefix{inode->get_key_prefix()};
    const auto key_prefix_length{key_prefix.length()};
    const auto shared_key_prefix_length{
        key_prefix.get_shared_length(remaining_key)};

    if (shared_key_prefix_length < key_prefix_length) {
      if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
        return {};  // LCOV_EXCL_LINE
      return std::make_optional<get_result>(std::nullopt);
    }

    UNODB_DETAIL_ASSERT(shared_key_prefix_length == key_prefix_length);

    remaining_key.shift_right(key_prefix_length);

    const auto* const child_in_parent{
        inode->find_child(node_type, remaining_key[0]).second};

    if (child_in_parent == nullptr) {
      if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
        return {};  // LCOV_EXCL_LINE
      return std::make_optional<get_result>(std::nullopt);
    }

    const auto child = child_in_parent->load();

    parent_critical_section = std::move(node_critical_section);
    node = child;
    remaining_key.shift_right(1);

    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) return {};
  }
}